

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransporthttp.c
# Opt level: O0

int IoTHubTransportHttp_DeviceMethod_Response
              (IOTHUB_DEVICE_HANDLE handle,METHOD_HANDLE methodId,uchar *response,
              size_t response_size,int status_response)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  int status_response_local;
  size_t response_size_local;
  uchar *response_local;
  METHOD_HANDLE methodId_local;
  IOTHUB_DEVICE_HANDLE handle_local;
  
  p_Var1 = xlogging_get_log_function();
  if (p_Var1 != (LOGGER_LOG)0x0) {
    (*p_Var1)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
              ,"IoTHubTransportHttp_DeviceMethod_Response",0x47a,1,"not implemented (yet)");
  }
  return 0x47b;
}

Assistant:

static int IoTHubTransportHttp_DeviceMethod_Response(IOTHUB_DEVICE_HANDLE handle, METHOD_HANDLE methodId, const unsigned char* response, size_t response_size, int status_response)
{
    (void)handle;
    (void)methodId;
    (void)response;
    (void)response_size;
    (void)status_response;
    LogError("not implemented (yet)");
    return MU_FAILURE;
}